

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConcurrentAssertionStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConcurrentAssertionStatement,slang::ast::AssertionKind&,slang::ast::AssertionExpr_const&,slang::ast::Statement_const*&,slang::ast::Statement_const*&,slang::SourceRange>
          (BumpAllocator *this,AssertionKind *args,AssertionExpr *args_1,Statement **args_2,
          Statement **args_3,SourceRange *args_4)

{
  AssertionKind AVar1;
  Statement *pSVar2;
  Statement *pSVar3;
  SourceLocation SVar4;
  SourceLocation SVar5;
  ConcurrentAssertionStatement *pCVar6;
  
  pCVar6 = (ConcurrentAssertionStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConcurrentAssertionStatement *)this->endPtr < pCVar6 + 1) {
    pCVar6 = (ConcurrentAssertionStatement *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pCVar6 + 1);
  }
  AVar1 = *args;
  pSVar2 = *args_2;
  pSVar3 = *args_3;
  SVar4 = args_4->startLoc;
  SVar5 = args_4->endLoc;
  (pCVar6->super_Statement).kind = ConcurrentAssertion;
  (pCVar6->super_Statement).syntax = (StatementSyntax *)0x0;
  (pCVar6->super_Statement).sourceRange.startLoc = SVar4;
  (pCVar6->super_Statement).sourceRange.endLoc = SVar5;
  pCVar6->propertySpec = args_1;
  pCVar6->ifTrue = pSVar2;
  pCVar6->ifFalse = pSVar3;
  pCVar6->assertionKind = AVar1;
  return pCVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }